

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::ExceptionToJSONMap
                   (string *__return_storage_ptr__,ExceptionType type,string *message,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *map)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  ulong uVar3;
  long lVar4;
  pointer __src;
  ulong uVar5;
  bool bVar6;
  yyjson_mut_doc *doc;
  yyjson_mut_val *pyVar7;
  ExceptionType extraout_DL;
  ExceptionType type_00;
  ExceptionType extraout_DL_00;
  yyjson_mut_val *pyVar8;
  yyjson_mut_val *root;
  char *pcVar9;
  string except_str;
  
  root = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  type_00 = extraout_DL;
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar1 = &doc->val_pool;
    root = (doc->val_pool).cur;
    if ((doc->val_pool).end == root) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      type_00 = extraout_DL_00;
      if (bVar6) {
        root = pyVar1->cur;
        goto LAB_017aa46b;
      }
LAB_017aa722:
      root = (yyjson_mut_val *)0x0;
    }
    else {
LAB_017aa46b:
      pyVar1->cur = root + 1;
      if (root == (yyjson_mut_val *)0x0) goto LAB_017aa722;
      root->tag = 7;
    }
    doc->root = root;
  }
  Exception::ExceptionTypeToString_abi_cxx11_(&except_str,(Exception *)(ulong)type,type_00);
  if (except_str._M_dataplus._M_p == (pointer)0x0) goto LAB_017aa5c3;
  if (doc == (yyjson_mut_doc *)0x0) goto LAB_017aa6d3;
  if ((root != (yyjson_mut_val *)0x0) && ((~(uint)root->tag & 7) == 0)) {
    pyVar1 = &doc->val_pool;
    pyVar8 = (doc->val_pool).cur;
    if ((ulong)(((long)(doc->val_pool).end - (long)pyVar8) / 0x18) < 2) {
      bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (!bVar6) goto LAB_017aa5c3;
      pyVar8 = pyVar1->cur;
    }
    pyVar1->cur = pyVar8 + 2;
    if (pyVar8 != (yyjson_mut_val *)0x0) {
      uVar3 = root->tag;
      pyVar8->tag = 0xe0d;
      (pyVar8->uni).str = "exception_type";
      pyVar2 = &doc->str_pool;
      pcVar9 = (doc->str_pool).cur;
      if (except_str._M_string_length < (ulong)((long)(doc->str_pool).end - (long)pcVar9)) {
LAB_017aa538:
        pyVar2->cur = pcVar9 + except_str._M_string_length + 1;
        if (pcVar9 != (char *)0x0) {
          switchD_016b0717::default(pcVar9,except_str._M_dataplus._M_p,except_str._M_string_length);
          pcVar9[except_str._M_string_length] = '\0';
          pyVar8[1].uni.ptr = pcVar9;
          pyVar8[1].tag = except_str._M_string_length << 8 | 5;
          pyVar7 = pyVar8;
          if (0xff < uVar3) {
            lVar4 = *(long *)((root->uni).u64 + 0x10);
            pyVar7 = *(yyjson_mut_val **)(lVar4 + 0x10);
            *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
          }
          pyVar8[1].next = pyVar7;
          pyVar8->next = pyVar8 + 1;
          (root->uni).u64 = (uint64_t)pyVar8;
          root->tag = (ulong)(byte)root->tag + (uVar3 & 0xffffffffffffff00) + 0x100;
          goto LAB_017aa5c3;
        }
      }
      else {
        bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                          (pyVar2,&doc->alc,except_str._M_string_length + 1);
        if (bVar6) {
          pcVar9 = pyVar2->cur;
          goto LAB_017aa538;
        }
      }
      pyVar8[1].uni.u64 = 0;
    }
  }
LAB_017aa5c3:
  if ((((doc == (yyjson_mut_doc *)0x0) || (root == (yyjson_mut_val *)0x0)) ||
      (__src = (message->_M_dataplus)._M_p, __src == (pointer)0x0)) || ((~(uint)root->tag & 7) != 0)
     ) goto LAB_017aa6d3;
  uVar3 = message->_M_string_length;
  pyVar1 = &doc->val_pool;
  pyVar8 = (doc->val_pool).cur;
  if ((ulong)(((long)(doc->val_pool).end - (long)pyVar8) / 0x18) < 2) {
    bVar6 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
    if (!bVar6) goto LAB_017aa6d3;
    pyVar8 = pyVar1->cur;
  }
  pyVar1->cur = pyVar8 + 2;
  if (pyVar8 == (yyjson_mut_val *)0x0) goto LAB_017aa6d3;
  uVar5 = root->tag;
  pyVar8->tag = 0x110d;
  (pyVar8->uni).str = "exception_message";
  pyVar2 = &doc->str_pool;
  pcVar9 = (doc->str_pool).cur;
  if (uVar3 < (ulong)((long)(doc->str_pool).end - (long)pcVar9)) {
LAB_017aa651:
    pyVar2->cur = pcVar9 + uVar3 + 1;
    if (pcVar9 != (char *)0x0) {
      switchD_016b0717::default(pcVar9,__src,uVar3);
      pcVar9[uVar3] = '\0';
      pyVar8[1].uni.ptr = pcVar9;
      pyVar8[1].tag = uVar3 << 8 | 5;
      pyVar7 = pyVar8;
      if (0xff < uVar5) {
        lVar4 = *(long *)((root->uni).u64 + 0x10);
        pyVar7 = *(yyjson_mut_val **)(lVar4 + 0x10);
        *(yyjson_mut_val **)(lVar4 + 0x10) = pyVar8;
      }
      pyVar8[1].next = pyVar7;
      pyVar8->next = pyVar8 + 1;
      (root->uni).u64 = (uint64_t)pyVar8;
      root->tag = (ulong)(byte)root->tag + (uVar5 & 0xffffffffffffff00) + 0x100;
      goto LAB_017aa6d3;
    }
  }
  else {
    bVar6 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar3 + 1);
    if (bVar6) {
      pcVar9 = pyVar2->cur;
      goto LAB_017aa651;
    }
  }
  pyVar8[1].uni.u64 = 0;
LAB_017aa6d3:
  ToJsonMapInternal(__return_storage_ptr__,map,doc,root);
  ::std::__cxx11::string::~string((string *)&except_str);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::ExceptionToJSONMap(ExceptionType type, const string &message,
                                      const unordered_map<string, string> &map) {
	D_ASSERT(map.find("exception_type") == map.end());
	D_ASSERT(map.find("exception_message") == map.end());

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	auto except_str = Exception::ExceptionTypeToString(type);
	yyjson_mut_obj_add_strncpy(doc, root, "exception_type", except_str.c_str(), except_str.size());
	yyjson_mut_obj_add_strncpy(doc, root, "exception_message", message.c_str(), message.size());

	return ToJsonMapInternal(map, doc, root);
}